

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  uint32_t result_id;
  Feature feature;
  bool bVar1;
  uint32_t uVar2;
  BaseType BVar3;
  uint32_t uVar4;
  uint32_t *ops;
  SPIRType *pSVar5;
  CompilerError *this_00;
  uint32_t uVar6;
  char *pcVar7;
  Op op;
  allocator local_59;
  BaseType local_58;
  BaseType local_54;
  string local_50;
  
  ops = Compiler::stream(&this->super_Compiler,i);
  op = (Op)i->op;
  if (((this->options).vulkan_semantics == false) &&
     (bVar1 = is_supported_subgroup_op_in_opengl(op,ops), !bVar1)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"This subgroup operation is only supported in Vulkan semantics.");
    goto LAB_0013e0e4;
  }
  uVar2 = get_integer_width_for_instruction(this,i);
  BVar3 = to_signed_basetype(uVar2);
  local_58 = to_unsigned_basetype(uVar2);
  local_54 = BVar3;
  switch(op - OpGroupNonUniformElect) {
  case OpNop:
    feature = SubgroupElect;
    break;
  case OpUndef:
  case OpSourceContinued:
  case OpSource:
    pSVar5 = Compiler::expression_type(&this->super_Compiler,ops[3]);
    if ((pSVar5->basetype == Boolean) && (pSVar5->vecsize == 1)) {
      feature = SubgroupAll_Any_AllEqualBool;
    }
    else {
      feature = SubgroupAllEqualT;
    }
    break;
  case OpSourceExtension:
  case OpName:
    feature = SubgroupBroadcast_First;
    break;
  case OpMemberName:
    feature = SubgroupBallot;
    break;
  case OpString:
switchD_0013d5f4_caseD_7:
    feature = SubgroupInverseBallot_InclBitCount_ExclBitCout;
    break;
  case OpLine:
    feature = SubgroupBallotBitExtract;
    break;
  case OpLine|OpUndef:
    if (ops[3] == 0) {
      feature = SubgroupBallotBitCount;
      break;
    }
    if (ops[3] < 3) goto switchD_0013d5f4_caseD_7;
    goto LAB_0013d8de;
  case OpExtension:
  case OpExtInstImport:
    feature = SubgroupBallotFindLSB_MSB;
    break;
  case OpExtInst:
  case OpExtInst|OpUndef:
    ::std::__cxx11::string::string((string *)&local_50,"GL_KHR_shader_subgroup_shuffle",&local_59);
    require_extension_internal(this,&local_50);
    goto LAB_0013d733;
  case OpMemoryModel:
  case OpEntryPoint:
    ::std::__cxx11::string::string
              ((string *)&local_50,"GL_KHR_shader_subgroup_shuffle_relative",&local_59);
    require_extension_internal(this,&local_50);
    goto LAB_0013d733;
  case OpExecutionMode:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIAddExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_50);
      goto LAB_0013d733;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpCapability:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFAddExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_50);
      goto LAB_0013d733;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpExecutionMode|OpSourceContinued:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIMulExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_50);
      goto LAB_0013d733;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeVoid:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFMulExclusiveScan;
      break;
    case 3:
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_50);
      goto LAB_0013d733;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeBool:
  case OpTypeInt:
  case OpTypeFloat:
  case OpTypeVector:
  case OpTypeMatrix:
  case OpTypeImage:
  case OpTypeSampler:
  case OpTypeSampledImage:
  case OpTypeArray:
  case OpTypeRuntimeArray:
  case OpTypeStruct:
  case OpTypeOpaque:
    if (ops[3] == 3) {
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered",&local_59);
      require_extension_internal(this,&local_50);
    }
    else {
      if (2 < ops[3]) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
        goto LAB_0013e0e4;
      }
      ::std::__cxx11::string::string
                ((string *)&local_50,"GL_KHR_shader_subgroup_arithmetic",&local_59);
      require_extension_internal(this,&local_50);
    }
    goto LAB_0013d733;
  case OpTypePointer:
  case OpTypeFunction:
    ::std::__cxx11::string::string((string *)&local_50,"GL_KHR_shader_subgroup_quad",&local_59);
    require_extension_internal(this,&local_50);
    goto LAB_0013d733;
  default:
    if (op != OpGroupNonUniformRotateKHR) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
      goto LAB_0013e0e4;
    }
    ::std::__cxx11::string::string((string *)&local_50,"GL_KHR_shader_subgroup_rotate",&local_59);
    require_extension_internal(this,&local_50);
LAB_0013d733:
    ::std::__cxx11::string::~string((string *)&local_50);
    goto LAB_0013d8de;
  }
  request_subgroup_feature(this,feature);
LAB_0013d8de:
  uVar2 = *ops;
  result_id = ops[1];
  uVar4 = Compiler::evaluate_constant_u32(&this->super_Compiler,ops[2]);
  if (uVar4 != 3) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
LAB_0013e0e4:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  BVar3 = local_58;
  switch(op - OpGroupNonUniformElect) {
  case OpNop:
    ::std::__cxx11::string::string((string *)&local_50,"subgroupElect()",&local_59);
    emit_op(this,uVar2,result_id,&local_50,true,false);
    ::std::__cxx11::string::~string((string *)&local_50);
    goto LAB_0013e013;
  case OpUndef:
    uVar4 = ops[3];
    pcVar7 = "subgroupAll";
    break;
  case OpSourceContinued:
    uVar4 = ops[3];
    pcVar7 = "subgroupAny";
    break;
  case OpSource:
    uVar4 = ops[3];
    pcVar7 = "subgroupAllEqual";
    break;
  case OpSourceExtension:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupBroadcast";
    goto LAB_0013dfe4;
  case OpName:
    uVar4 = ops[3];
    pcVar7 = "subgroupBroadcastFirst";
    break;
  case OpMemberName:
    uVar4 = ops[3];
    pcVar7 = "subgroupBallot";
    break;
  case OpString:
    uVar4 = ops[3];
    pcVar7 = "subgroupInverseBallot";
    break;
  case OpLine:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupBallotBitExtract";
    goto LAB_0013dfe4;
  case OpLine|OpUndef:
    uVar4 = ops[3];
    if (uVar4 == 2) {
      uVar4 = ops[4];
      pcVar7 = "subgroupBallotExclusiveBitCount";
    }
    else if (uVar4 == 1) {
      uVar4 = ops[4];
      pcVar7 = "subgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar4 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_0013e0e4;
      }
      uVar4 = ops[4];
      pcVar7 = "subgroupBallotBitCount";
    }
    break;
  case OpExtension:
    uVar4 = ops[3];
    pcVar7 = "subgroupBallotFindLSB";
    break;
  case OpExtInstImport:
    uVar4 = ops[3];
    pcVar7 = "subgroupBallotFindMSB";
    break;
  case OpExtInst:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupShuffle";
    goto LAB_0013dfe4;
  case OpExtInst|OpUndef:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupShuffleXor";
    goto LAB_0013dfe4;
  case OpMemoryModel:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupShuffleUp";
    goto LAB_0013dfe4;
  case OpEntryPoint:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupShuffleDown";
    goto LAB_0013dfe4;
  case OpExecutionMode:
    switch(ops[3]) {
    case 0:
      goto switchD_0013db6f_caseD_0;
    case 1:
switchD_0013db6f_caseD_1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveAdd";
      break;
    case 2:
switchD_0013db6f_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveAdd";
      break;
    case 3:
switchD_0013db6f_caseD_3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredAdd";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpCapability:
    switch(ops[3]) {
    case 0:
      goto switchD_0013db6f_caseD_0;
    case 1:
      goto switchD_0013db6f_caseD_1;
    case 2:
      goto switchD_0013db6f_caseD_2;
    case 3:
      goto switchD_0013db6f_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
  case OpExecutionMode|OpSourceContinued:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dce3_caseD_0;
    case 1:
switchD_0013dce3_caseD_1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveMul";
      break;
    case 2:
switchD_0013dce3_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveMul";
      break;
    case 3:
switchD_0013dce3_caseD_3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredMul";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeVoid:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dce3_caseD_0;
    case 1:
      goto switchD_0013dce3_caseD_1;
    case 2:
      goto switchD_0013dce3_caseD_2;
    case 3:
      goto switchD_0013dce3_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
  case OpTypeBool:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      BVar3 = local_54;
      goto LAB_0013dbe1;
    case 1:
      uVar4 = ops[4];
      BVar3 = local_54;
LAB_0013dfb8:
      pcVar7 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar4 = ops[4];
      BVar3 = local_54;
LAB_0013df6b:
      pcVar7 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      BVar3 = local_54;
LAB_0013df95:
      pcVar7 = "subgroupClusteredMin";
LAB_0013e058:
      emit_binary_func_op_cast_clustered(this,uVar2,result_id,uVar4,uVar6,pcVar7,BVar3);
      goto LAB_0013e013;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    goto LAB_0013e07f;
  case OpTypeInt:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      break;
    case 1:
      uVar4 = ops[4];
      goto LAB_0013dfb8;
    case 2:
      uVar4 = ops[4];
      goto LAB_0013df6b;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      goto LAB_0013df95;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
LAB_0013dbe1:
    pcVar7 = "subgroupMin";
    goto LAB_0013e07f;
  case OpTypeFloat:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      pcVar7 = "subgroupMin";
      break;
    case 1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredMin";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeVector:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      BVar3 = local_54;
      goto LAB_0013dd1c;
    case 1:
      uVar4 = ops[4];
      BVar3 = local_54;
LAB_0013e074:
      pcVar7 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar4 = ops[4];
      BVar3 = local_54;
LAB_0013e035:
      pcVar7 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      BVar3 = local_54;
LAB_0013e04e:
      pcVar7 = "subgroupClusteredMax";
      goto LAB_0013e058;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    goto LAB_0013e07f;
  case OpTypeMatrix:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      break;
    case 1:
      uVar4 = ops[4];
      goto LAB_0013e074;
    case 2:
      uVar4 = ops[4];
      goto LAB_0013e035;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      goto LAB_0013e04e;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
LAB_0013dd1c:
    pcVar7 = "subgroupMax";
LAB_0013e07f:
    emit_unary_func_op_cast(this,uVar2,result_id,uVar4,pcVar7,BVar3,BVar3);
    goto LAB_0013e013;
  case OpTypeImage:
    switch(ops[3]) {
    case 0:
      uVar4 = ops[4];
      pcVar7 = "subgroupMax";
      break;
    case 1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredMax";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeSampler:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dd76_caseD_0;
    case 1:
switchD_0013dd76_caseD_1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveAnd";
      break;
    case 2:
switchD_0013dd76_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveAnd";
      break;
    case 3:
switchD_0013dd76_caseD_3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredAnd";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeSampledImage:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dc73_caseD_0;
    case 1:
switchD_0013dc73_caseD_1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveOr";
      break;
    case 2:
switchD_0013dc73_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveOr";
      break;
    case 3:
switchD_0013dc73_caseD_3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredOr";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeArray:
    switch(ops[3]) {
    case 0:
      goto switchD_0013db51_caseD_0;
    case 1:
switchD_0013db51_caseD_1:
      uVar4 = ops[4];
      pcVar7 = "subgroupInclusiveXor";
      break;
    case 2:
switchD_0013db51_caseD_2:
      uVar4 = ops[4];
      pcVar7 = "subgroupExclusiveXor";
      break;
    case 3:
switchD_0013db51_caseD_3:
      uVar4 = ops[4];
      uVar6 = ops[5];
      pcVar7 = "subgroupClusteredXor";
      goto LAB_0013dfe4;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
    break;
  case OpTypeRuntimeArray:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dd76_caseD_0;
    case 1:
      goto switchD_0013dd76_caseD_1;
    case 2:
      goto switchD_0013dd76_caseD_2;
    case 3:
      goto switchD_0013dd76_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
  case OpTypeStruct:
    switch(ops[3]) {
    case 0:
      goto switchD_0013dc73_caseD_0;
    case 1:
      goto switchD_0013dc73_caseD_1;
    case 2:
      goto switchD_0013dc73_caseD_2;
    case 3:
      goto switchD_0013dc73_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
  case OpTypeOpaque:
    switch(ops[3]) {
    case 0:
      goto switchD_0013db51_caseD_0;
    case 1:
      goto switchD_0013db51_caseD_1;
    case 2:
      goto switchD_0013db51_caseD_2;
    case 3:
      goto switchD_0013db51_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_0013e0e4;
    }
  case OpTypePointer:
    uVar4 = ops[3];
    uVar6 = ops[4];
    pcVar7 = "subgroupQuadBroadcast";
    goto LAB_0013dfe4;
  case OpTypeFunction:
    uVar4 = Compiler::evaluate_constant_u32(&this->super_Compiler,ops[4]);
    if (uVar4 == 2) {
      uVar4 = ops[3];
      pcVar7 = "subgroupQuadSwapDiagonal";
    }
    else if (uVar4 == 1) {
      uVar4 = ops[3];
      pcVar7 = "subgroupQuadSwapVertical";
    }
    else {
      if (uVar4 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid quad swap direction.");
        goto LAB_0013e0e4;
      }
      uVar4 = ops[3];
      pcVar7 = "subgroupQuadSwapHorizontal";
    }
    break;
  default:
    if (op != OpGroupNonUniformRotateKHR) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
      goto LAB_0013e0e4;
    }
    uVar4 = ops[3];
    uVar6 = ops[4];
    if (5 < i->length) {
      emit_trinary_func_op(this,uVar2,result_id,uVar4,uVar6,ops[5],"subgroupClusteredRotate");
      goto LAB_0013e013;
    }
    pcVar7 = "subgroupRotate";
LAB_0013dfe4:
    emit_binary_func_op(this,uVar2,result_id,uVar4,uVar6,pcVar7);
    goto LAB_0013e013;
  }
LAB_0013e002:
  emit_unary_func_op(this,uVar2,result_id,uVar4,pcVar7);
LAB_0013e013:
  register_control_dependent_expression(this,result_id);
  return;
switchD_0013db51_caseD_0:
  uVar4 = ops[4];
  pcVar7 = "subgroupXor";
  goto LAB_0013e002;
switchD_0013dc73_caseD_0:
  uVar4 = ops[4];
  pcVar7 = "subgroupOr";
  goto LAB_0013e002;
switchD_0013dd76_caseD_0:
  uVar4 = ops[4];
  pcVar7 = "subgroupAnd";
  goto LAB_0013e002;
switchD_0013dce3_caseD_0:
  uVar4 = ops[4];
  pcVar7 = "subgroupMul";
  goto LAB_0013e002;
switchD_0013db6f_caseD_0:
  uVar4 = ops[4];
  pcVar7 = "subgroupAdd";
  goto LAB_0013e002;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op, ops))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBroadcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformRotateKHR:
		require_extension_internal("GL_KHR_shader_subgroup_rotate");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	// clang-format off
#define GLSL_GROUP_OP(OP)\
	case OpGroupNonUniform##OP:\
	{\
		auto operation = static_cast<GroupOperation>(ops[3]);\
		if (operation == GroupOperationClusteredReduce)\
			require_extension_internal("GL_KHR_shader_subgroup_clustered");\
		else if (operation == GroupOperationReduce)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##Reduce);\
		else if (operation == GroupOperationExclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##ExclusiveScan);\
		else if (operation == GroupOperationInclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##InclusiveScan);\
		else\
			SPIRV_CROSS_THROW("Invalid group operation.");\
		break;\
	}

	GLSL_GROUP_OP(IAdd)
	GLSL_GROUP_OP(FAdd)
	GLSL_GROUP_OP(IMul)
	GLSL_GROUP_OP(FMul)

#undef GLSL_GROUP_OP
	// clang-format on

	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	case OpGroupNonUniformLogicalAnd:
	case OpGroupNonUniformLogicalOr:
	case OpGroupNonUniformLogicalXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformRotateKHR:
		if (i.length > 5)
			emit_trinary_func_op(result_type, id, ops[3], ops[4], ops[5], "subgroupClusteredRotate");
		else
			emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupRotate");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
	GLSL_GROUP_OP(LogicalAnd, And)
	GLSL_GROUP_OP(LogicalOr, Or)
	GLSL_GROUP_OP(LogicalXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}